

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::logic_t>::emplace_back<slang::logic_t_const&>
          (SmallVectorBase<slang::logic_t> *this,logic_t *args)

{
  iterator plVar1;
  uint8_t *in_RSI;
  SmallVectorBase<slang::logic_t> *in_RDI;
  logic_t *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::logic_t> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::logic_t_const&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    plVar1 = end(in_RDI);
    plVar1->value = *in_RSI;
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }